

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreplyhttpimpl_p.cpp
# Opt level: O3

int __thiscall
QNetworkReplyHttpImpl::qt_metacall(QNetworkReplyHttpImpl *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  Call _c_00;
  
  _id_00 = QNetworkReply::qt_metacall((QNetworkReply *)this,_c,_id,_a);
  if ((int)_id_00 < 0) {
    return _id_00;
  }
  if (_c == RegisterMethodArgumentMetaType) {
    if (0x1f < _id_00) goto LAB_0021ad3a;
    _c_00 = RegisterMethodArgumentMetaType;
  }
  else {
    if (_c != InvokeMetaMethod) {
      return _id_00;
    }
    if (0x1f < _id_00) goto LAB_0021ad3a;
    _c_00 = InvokeMetaMethod;
  }
  qt_static_metacall((QObject *)this,_c_00,_id_00,_a);
LAB_0021ad3a:
  return _id_00 - 0x20;
}

Assistant:

int QNetworkReplyHttpImpl::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QNetworkReply::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 32)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 32;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 32)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 32;
    }
    return _id;
}